

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare_test.c
# Opt level: O2

int version_test(char *v1,char *v2,int flags1,int flags2,int expected)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar2 = (ulong)(uint)flags2;
  if (flags2 == 0 && flags1 == 0) {
    iVar1 = version_compare2();
  }
  else {
    iVar1 = version_compare4(v1,v2,flags1,uVar2);
  }
  uVar3 = (ulong)((expected != 0) + 0x3d);
  if (expected < 0) {
    uVar3 = 0x3c;
  }
  if (iVar1 == expected) {
    iVar1 = 0;
    fprintf(_stderr,"[ OK ] \"%s\" (0x%x) %c \"%s\" (0x%x)\n",v1,(ulong)(uint)flags1,uVar3,v2,uVar2)
    ;
  }
  else {
    uVar4 = (ulong)((iVar1 != 0) + 0x3d);
    if (iVar1 < 0) {
      uVar4 = 0x3c;
    }
    fprintf(_stderr,"[FAIL] \"%s\" (0x%x) %c \"%s\" (0x%x): got %c\n",v1,(ulong)(uint)flags1,uVar3,
            v2,uVar2,uVar4);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int version_test(const char* v1, const char* v2, int flags1, int flags2, int expected) {
	int result;

	if (flags1 == 0 && flags2 == 0) {
		result = version_compare2(v1, v2);
	} else {
		result = version_compare4(v1, v2, flags1, flags2);
	}

	if (result == expected) {
		fprintf(stderr, "[ OK ] \"%s\" (0x%x) %c \"%s\" (0x%x)\n", v1, flags1, comparison_to_char(expected), v2, flags2);
		return 0;
	} else {
		fprintf(stderr, "[FAIL] \"%s\" (0x%x) %c \"%s\" (0x%x): got %c\n", v1, flags1, comparison_to_char(expected), v2, flags2, comparison_to_char(result));
		return 1;
	}
}